

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cproxy.c
# Opt level: O2

void http_digest_response
               (BinarySink *bs,ptrlen username,ptrlen password,ptrlen realm,ptrlen method,ptrlen uri
               ,ptrlen qop,ptrlen nonce,ptrlen opaque,uint32_t nonce_count,HttpDigestHash hash,
               _Bool hash_username)

{
  ssh_hashalg *alg;
  size_t len;
  BinarySink *bs_00;
  ssh_hash *psVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  ptrlen pl;
  ptrlen pl_00;
  ptrlen pl_01;
  ptrlen pl_02;
  ptrlen pl_03;
  ptrlen pl_04;
  ptrlen pl_05;
  ptrlen pl_06;
  ptrlen pl_07;
  ptrlen pl_08;
  ptrlen pl_09;
  ptrlen pl_10;
  ptrlen pl_11;
  ptrlen pl_12;
  uchar ncbuf [4];
  char client_nonce_base64 [44];
  uchar client_nonce_raw [33];
  uchar rsphash [114];
  uchar a2hash [114];
  uchar a1hash [114];
  
  alg = httphashalgs[hash];
  ncbuf = (uchar  [4])
          (nonce_count >> 0x18 | (nonce_count & 0xff0000) >> 8 | (nonce_count & 0xff00) << 8 |
          nonce_count << 0x18);
  len = httphashlengths[hash];
  random_read(client_nonce_raw,0x21);
  pcVar4 = client_nonce_base64;
  for (lVar3 = 0; lVar3 != 0x21; lVar3 = lVar3 + 3) {
    base64_encode_atom(client_nonce_raw + lVar3,3,pcVar4);
    pcVar4 = pcVar4 + 4;
  }
  psVar1 = ssh_hash_new(alg);
  BinarySink_put_datapl(psVar1->binarysink_,username);
  BinarySink_put_byte(psVar1->binarysink_,':');
  BinarySink_put_datapl(psVar1->binarysink_,realm);
  BinarySink_put_byte(psVar1->binarysink_,':');
  BinarySink_put_datapl(psVar1->binarysink_,password);
  ssh_hash_digest_nondestructive(psVar1,a1hash);
  (*psVar1->vt->reset)(psVar1);
  BinarySink_put_datapl(psVar1->binarysink_,method);
  BinarySink_put_byte(psVar1->binarysink_,':');
  BinarySink_put_datapl(psVar1->binarysink_,uri);
  ssh_hash_digest_nondestructive(psVar1,a2hash);
  (*psVar1->vt->reset)(psVar1);
  BinarySink_put_hex_data(psVar1->binarysink_,a1hash,len);
  BinarySink_put_byte(psVar1->binarysink_,':');
  BinarySink_put_datapl(psVar1->binarysink_,nonce);
  BinarySink_put_byte(psVar1->binarysink_,':');
  BinarySink_put_hex_data(psVar1->binarysink_,ncbuf,4);
  BinarySink_put_byte(psVar1->binarysink_,':');
  BinarySink_put_data(psVar1->binarysink_,client_nonce_base64,0x2c);
  BinarySink_put_byte(psVar1->binarysink_,':');
  BinarySink_put_datapl(psVar1->binarysink_,qop);
  BinarySink_put_byte(psVar1->binarysink_,':');
  BinarySink_put_hex_data(psVar1->binarysink_,a2hash,len);
  ssh_hash_final(psVar1,rsphash);
  pl.len = 10;
  pl.ptr = "username=\"";
  BinarySink_put_datapl(bs->binarysink_,pl);
  if (hash_username) {
    psVar1 = ssh_hash_new(alg);
    BinarySink_put_datapl(psVar1->binarysink_,username);
    BinarySink_put_byte(psVar1->binarysink_,':');
    BinarySink_put_datapl(psVar1->binarysink_,realm);
    ssh_hash_final(psVar1,a1hash);
    BinarySink_put_hex_data(bs->binarysink_,a1hash,len);
  }
  else {
    BinarySink_put_datapl(bs->binarysink_,username);
  }
  pl_00.len = 10;
  pl_00.ptr = "\", realm=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_00);
  BinarySink_put_datapl(bs->binarysink_,realm);
  pl_01.len = 8;
  pl_01.ptr = "\", uri=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_01);
  BinarySink_put_datapl(bs->binarysink_,uri);
  pl_02.len = 0xd;
  pl_02.ptr = "\", algorithm=";
  BinarySink_put_datapl(bs->binarysink_,pl_02);
  bs_00 = bs->binarysink_;
  pcVar4 = httphashnames[hash];
  sVar2 = strlen(pcVar4);
  pl_03.len = sVar2;
  pl_03.ptr = pcVar4;
  BinarySink_put_datapl(bs_00,pl_03);
  pl_04.len = 9;
  pl_04.ptr = ", nonce=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_04);
  BinarySink_put_datapl(bs->binarysink_,nonce);
  pl_05.len = 6;
  pl_05.ptr = "\", nc=";
  BinarySink_put_datapl(bs->binarysink_,pl_05);
  BinarySink_put_hex_data(bs->binarysink_,ncbuf,4);
  pl_06.len = 10;
  pl_06.ptr = ", cnonce=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_06);
  BinarySink_put_data(bs->binarysink_,client_nonce_base64,0x2c);
  pl_07.len = 7;
  pl_07.ptr = "\", qop=";
  BinarySink_put_datapl(bs->binarysink_,pl_07);
  BinarySink_put_datapl(bs->binarysink_,qop);
  pl_08.len = 0xc;
  pl_08.ptr = ", response=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_08);
  BinarySink_put_hex_data(bs->binarysink_,rsphash,len);
  pl_09.len = 1;
  pl_09.ptr = "\"";
  BinarySink_put_datapl(bs->binarysink_,pl_09);
  if (opaque.ptr != (void *)0x0) {
    pl_10.len = 10;
    pl_10.ptr = ", opaque=\"";
    BinarySink_put_datapl(bs->binarysink_,pl_10);
    BinarySink_put_datapl(bs->binarysink_,opaque);
    pl_11.len = 1;
    pl_11.ptr = "\"";
    BinarySink_put_datapl(bs->binarysink_,pl_11);
  }
  if (hash_username) {
    pl_12.len = 0xf;
    pl_12.ptr = ", userhash=true";
    BinarySink_put_datapl(bs->binarysink_,pl_12);
  }
  smemclr(a1hash,0x72);
  smemclr(a2hash,0x72);
  smemclr(rsphash,0x72);
  smemclr(client_nonce_raw,0x21);
  smemclr(client_nonce_base64,0x2c);
  return;
}

Assistant:

void http_digest_response(BinarySink *bs, ptrlen username, ptrlen password,
                          ptrlen realm, ptrlen method, ptrlen uri, ptrlen qop,
                          ptrlen nonce, ptrlen opaque, uint32_t nonce_count,
                          HttpDigestHash hash, bool hash_username)
{
    unsigned char a1hash[MAX_HASH_LEN];
    unsigned char a2hash[MAX_HASH_LEN];
    unsigned char rsphash[MAX_HASH_LEN];
    const ssh_hashalg *alg = httphashalgs[hash];
    size_t hashlen = httphashlengths[hash];

    unsigned char ncbuf[4];
    PUT_32BIT_MSB_FIRST(ncbuf, nonce_count);

    unsigned char client_nonce_raw[33];
    random_read(client_nonce_raw, lenof(client_nonce_raw));
    char client_nonce_base64[lenof(client_nonce_raw) / 3 * 4];
    for (unsigned i = 0; i < lenof(client_nonce_raw)/3; i++)
        base64_encode_atom(client_nonce_raw + 3*i, 3,
                           client_nonce_base64 + 4*i);

    /*
     * RFC 7616 section 3.4.2: the hash "A1" is a hash of
     * username:realm:password (in the absence of hash names like
     * "MD5-sess" which as far as I know don't sensibly apply to
     * proxies and HTTP CONNECT).
     */
    ssh_hash *h = ssh_hash_new(alg);
    put_datapl(h, username);
    put_byte(h, ':');
    put_datapl(h, realm);
    put_byte(h, ':');
    put_datapl(h, password);
    ssh_hash_digest_nondestructive(h, a1hash);

    /*
     * RFC 7616 section 3.4.3: the hash "A2" is a hash of method:uri
     * (in the absence of more interesting quality-of-protection
     * schemes than plain "auth" - e.g. "auth-int" hashes the entire
     * document as well - which again I don't think make sense in the
     * context of proxies and CONNECT).
     */
    ssh_hash_reset(h);
    put_datapl(h, method);
    put_byte(h, ':');
    put_datapl(h, uri);
    ssh_hash_digest_nondestructive(h, a2hash);

    /*
     * RFC 7616 section 3.4.1: the overall output hash in the
     * "response" parameter of the authorization header is a hash of
     * A1:nonce:nonce-count:client-nonce:qop:A2, where A1 and A2 are
     * the hashes computed above.
     */
    ssh_hash_reset(h);
    put_hex_data(h, a1hash, hashlen);
    put_byte(h, ':');
    put_datapl(h, nonce);
    put_byte(h, ':');
    put_hex_data(h, ncbuf, 4);
    put_byte(h, ':');
    put_data(h, client_nonce_base64, lenof(client_nonce_base64));
    put_byte(h, ':');
    put_datapl(h, qop);
    put_byte(h, ':');
    put_hex_data(h, a2hash, hashlen);
    ssh_hash_final(h, rsphash);

    /*
     * Now construct the output header (everything after the initial
     * "Proxy-Authorization: Digest ") and write it to the provided
     * BinarySink.
     */
    put_datalit(bs, "username=\"");
    if (hash_username) {
        /*
         * RFC 7616 section 3.4.4: if we're hashing the username, we
         * actually hash username:realm (like a truncated version of
         * A1 above).
         */
        ssh_hash *h = ssh_hash_new(alg);
        put_datapl(h, username);
        put_byte(h, ':');
        put_datapl(h, realm);
        ssh_hash_final(h, a1hash);
        put_hex_data(bs, a1hash, hashlen);
    } else {
        put_datapl(bs, username);
    }
    put_datalit(bs, "\", realm=\"");
    put_datapl(bs, realm);
    put_datalit(bs, "\", uri=\"");
    put_datapl(bs, uri);
    put_datalit(bs, "\", algorithm=");
    put_dataz(bs, httphashnames[hash]);
    put_datalit(bs, ", nonce=\"");
    put_datapl(bs, nonce);
    put_datalit(bs, "\", nc=");
    put_hex_data(bs, ncbuf, 4);
    put_datalit(bs, ", cnonce=\"");
    put_data(bs, client_nonce_base64, lenof(client_nonce_base64));
    put_datalit(bs, "\", qop=");
    put_datapl(bs, qop);
    put_datalit(bs, ", response=\"");
    put_hex_data(bs, rsphash, hashlen);
    put_datalit(bs, "\"");

    if (opaque.ptr) {
        put_datalit(bs, ", opaque=\"");
        put_datapl(bs, opaque);
        put_datalit(bs, "\"");
    }

    if (hash_username) {
        put_datalit(bs, ", userhash=true");
    }

    smemclr(a1hash, lenof(a1hash));
    smemclr(a2hash, lenof(a2hash));
    smemclr(rsphash, lenof(rsphash));
    smemclr(client_nonce_raw, lenof(client_nonce_raw));
    smemclr(client_nonce_base64, lenof(client_nonce_base64));
}